

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData256 * cfd::core::HashUtil::Sha256(ByteData256 *__return_storage_ptr__,string *str)

{
  CfdException *this;
  allocator local_5d;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  string local_40;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&output,0x20,(allocator_type *)&local_40);
  ret = wally_sha256((uchar *)(str->_M_dataplus)._M_p,str->_M_string_length,
                     output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData256::ByteData256(__return_storage_ptr__,&output);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_40._M_dataplus._M_p = "cfdcore_util.cpp";
  local_40._M_string_length._0_4_ = 0x10e;
  local_40.field_2._M_allocated_capacity = (long)"HmacSha256" + 4;
  logger::warn<int&>((CfdSourceLocation *)&local_40,"wally_sha256 NG[{}].",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_40,"sha256 calc error.",&local_5d);
  CfdException::CfdException(this,kCfdIllegalStateError,&local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 HashUtil::Sha256(const std::string &str) {
  std::vector<uint8_t> output(SHA256_LEN);

  // SHA256
  int ret = wally_sha256(
      reinterpret_cast<const uint8_t *>(str.data()), str.size(), output.data(),
      output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_sha256 NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "sha256 calc error.");
  }

  return ByteData256(output);
}